

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O3

string * __thiscall
VolumeFile::getEntryPath
          (string *__return_storage_ptr__,VolumeFile *this,EntryKey *entryKey,string *prefix)

{
  pointer pcVar1;
  bool bVar2;
  StringKey extKey;
  StringKey nameKey;
  StringBTree extBtree;
  StringBTree nameBtree;
  StringKey local_50;
  StringKey local_40;
  BTree<StringBTree,_StringKey> local_30;
  BTree<StringBTree,_StringKey> local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + prefix->_M_string_length);
  local_28.m_data =
       (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + this->m_nameTreeOffset;
  local_40.m_value = (char *)0x0;
  local_40.m_length = 0;
  bVar2 = BTree<StringBTree,_StringKey>::searchByIndex(&local_28,entryKey->m_nameIndex,&local_40);
  if (bVar2) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               (ulong)local_40.m_value);
  }
  if ((entryKey->m_flags & 2) == 0) {
    if ((entryKey->m_flags & 1) != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  else {
    local_30.m_data =
         (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + this->m_extTreeOffset;
    local_50.m_value = (char *)0x0;
    local_50.m_length = 0;
    bVar2 = BTree<StringBTree,_StringKey>::searchByIndex(&local_30,entryKey->m_extIndex,&local_50);
    if ((bVar2) && (local_50.m_length != 0)) {
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
                 (ulong)local_50.m_value);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VolumeFile::getEntryPath(const EntryKey& entryKey, const std::string& prefix) const
{
	std::string path(prefix);

	StringBTree nameBtree(
		advancePointer(m_data.data(), nameTreeOffset())
	);
	StringKey nameKey;
	if (nameBtree.searchByIndex(entryKey.nameIndex(), nameKey)) {
		path.append(nameKey.value(), nameKey.value() + nameKey.length());
	}

	if (entryKey.isFile()) {
		StringBTree extBtree(
			advancePointer(m_data.data(), extTreeOffset())
		);
		StringKey extKey;
		if (extBtree.searchByIndex(entryKey.extIndex(), extKey)) {
			if (extKey.length() > 0) {
				path.append(extKey.value(), extKey.value() + extKey.length());
			}
		}
	} else if (entryKey.isDirectory()) {
		path += '/';
	}

	return path;
}